

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_uu.c
# Opt level: O0

int uudecode_bidder_bid(archive_read_filter_bidder *self,archive_read_filter *filter)

{
  int iVar1;
  byte *pbVar2;
  ulong local_58;
  size_t nbytes_read;
  int firstline;
  int l;
  ssize_t nl;
  ssize_t len;
  ssize_t ravail;
  ssize_t avail;
  uchar *b;
  archive_read_filter *filter_local;
  archive_read_filter_bidder *self_local;
  
  b = (uchar *)filter;
  filter_local = (archive_read_filter *)self;
  avail = (ssize_t)__archive_read_filter_ahead(filter,1,&ravail);
  if ((void *)avail == (void *)0x0) {
    return 0;
  }
  nbytes_read._0_4_ = 0x14;
  len = ravail;
  local_58 = ravail;
  while( true ) {
    nl = bid_get_line((archive_read_filter *)b,(uchar **)&avail,&ravail,&len,(ssize_t *)&firstline,
                      &local_58);
    if ((nl < 0) || (_firstline == 0)) {
      return 0;
    }
    if ((nl - _firstline < 0xb) || (iVar1 = memcmp((void *)avail,"begin ",6), iVar1 != 0)) {
      if ((nl - _firstline < 0x12) ||
         (iVar1 = memcmp((void *)avail,"begin-base64 ",0xd), iVar1 != 0)) {
        nbytes_read._4_4_ = 0;
      }
      else {
        nbytes_read._4_4_ = 0xd;
      }
    }
    else {
      nbytes_read._4_4_ = 6;
    }
    if ((nbytes_read._4_4_ != 0) &&
       (((((*(byte *)(avail + (int)nbytes_read._4_4_) < 0x30 ||
           (0x37 < *(byte *)(avail + (int)nbytes_read._4_4_))) ||
          (*(byte *)(avail + (int)(nbytes_read._4_4_ + 1)) < 0x30)) ||
         ((0x37 < *(byte *)(avail + (int)(nbytes_read._4_4_ + 1)) ||
          (*(byte *)(avail + (int)(nbytes_read._4_4_ + 2)) < 0x30)))) ||
        ((0x37 < *(byte *)(avail + (int)(nbytes_read._4_4_ + 2)) ||
         (*(char *)(avail + (int)(nbytes_read._4_4_ + 3)) != ' ')))))) {
      nbytes_read._4_4_ = 0;
    }
    avail = nl + avail;
    ravail = ravail - nl;
    if (nbytes_read._4_4_ != 0) break;
    nbytes_read._0_4_ = 0;
    if (0x1ffff < local_58) {
      return 0;
    }
  }
  if (ravail == 0) {
    return 0;
  }
  nl = bid_get_line((archive_read_filter *)b,(uchar **)&avail,&ravail,&len,(ssize_t *)&firstline,
                    &local_58);
  if ((nl < 0) || (_firstline == 0)) {
    return 0;
  }
  ravail = ravail - nl;
  if (nbytes_read._4_4_ == 6) {
    if (""[*(byte *)avail] == '\0') {
      return 0;
    }
    nbytes_read._4_4_ = *(byte *)avail - 0x20 & 0x3f;
    nl = nl + -1;
    avail = avail + 1;
    if (0x2d < nbytes_read._4_4_) {
      return 0;
    }
    while (nbytes_read._4_4_ != 0 && 0 < nl - _firstline) {
      if (0 < (int)nbytes_read._4_4_) {
        pbVar2 = (byte *)(avail + 1);
        if (""[*(byte *)avail] == '\0') {
          return 0;
        }
        avail = avail + 2;
        if (""[*pbVar2] == '\0') {
          return 0;
        }
        nl = nl + -2;
        nbytes_read._4_4_ = nbytes_read._4_4_ - 1;
      }
      if (0 < (int)nbytes_read._4_4_) {
        if (""[*(byte *)avail] == '\0') {
          return 0;
        }
        nl = nl + -1;
        nbytes_read._4_4_ = nbytes_read._4_4_ - 1;
        avail = avail + 1;
      }
      if (0 < (int)nbytes_read._4_4_) {
        if (""[*(byte *)avail] == '\0') {
          return 0;
        }
        nl = nl + -1;
        nbytes_read._4_4_ = nbytes_read._4_4_ - 1;
        avail = avail + 1;
      }
    }
    if (nl - _firstline < 0) {
      return 0;
    }
    if ((nl - _firstline == 1) &&
       ((""[*(byte *)avail] != '\0' || ((0x60 < *(byte *)avail && (*(byte *)avail < 0x7b)))))) {
      avail = avail + 1;
      nl = nl + -1;
    }
    avail = _firstline + avail;
    if ((ravail != 0) && (""[*(byte *)avail] != '\0')) {
      return (int)nbytes_read + 0x1e;
    }
  }
  if (nbytes_read._4_4_ == 0xd) {
    for (; 0 < nl - _firstline; nl = nl + -1) {
      if (""[*(byte *)avail] == '\0') {
        return 0;
      }
      avail = avail + 1;
    }
    avail = _firstline + avail;
    if ((4 < ravail) && (iVar1 = memcmp((void *)avail,"====\n",5), iVar1 == 0)) {
      return (int)nbytes_read + 0x28;
    }
    if ((5 < ravail) && (iVar1 = memcmp((void *)avail,"====\r\n",6), iVar1 == 0)) {
      return (int)nbytes_read + 0x28;
    }
    if ((0 < ravail) && (""[*(byte *)avail] != '\0')) {
      return (int)nbytes_read + 0x1e;
    }
  }
  return 0;
}

Assistant:

static int
uudecode_bidder_bid(struct archive_read_filter_bidder *self,
    struct archive_read_filter *filter)
{
	const unsigned char *b;
	ssize_t avail, ravail;
	ssize_t len, nl;
	int l;
	int firstline;
	size_t nbytes_read;

	(void)self; /* UNUSED */

	b = __archive_read_filter_ahead(filter, 1, &avail);
	if (b == NULL)
		return (0);

	firstline = 20;
	ravail = avail;
	nbytes_read = avail;
	for (;;) {
		len = bid_get_line(filter, &b, &avail, &ravail, &nl, &nbytes_read);
		if (len < 0 || nl == 0)
			return (0); /* No match found. */
		if (len - nl >= 11 && memcmp(b, "begin ", 6) == 0)
			l = 6;
		else if (len -nl >= 18 && memcmp(b, "begin-base64 ", 13) == 0)
			l = 13;
		else
			l = 0;

		if (l > 0 && (b[l] < '0' || b[l] > '7' ||
		    b[l+1] < '0' || b[l+1] > '7' ||
		    b[l+2] < '0' || b[l+2] > '7' || b[l+3] != ' '))
			l = 0;

		b += len;
		avail -= len;
		if (l)
			break;
		firstline = 0;

		/* Do not read more than UUENCODE_BID_MAX_READ bytes */
		if (nbytes_read >= UUENCODE_BID_MAX_READ)
			return (0);
	}
	if (!avail)
		return (0);
	len = bid_get_line(filter, &b, &avail, &ravail, &nl, &nbytes_read);
	if (len < 0 || nl == 0)
		return (0);/* There are non-ascii characters. */
	avail -= len;

	if (l == 6) {
		if (!uuchar[*b])
			return (0);
		/* Get a length of decoded bytes. */
		l = UUDECODE(*b++); len--;
		if (l > 45)
			/* Normally, maximum length is 45(character 'M'). */
			return (0);
		while (l && len-nl > 0) {
			if (l > 0) {
				if (!uuchar[*b++])
					return (0);
				if (!uuchar[*b++])
					return (0);
				len -= 2;
				--l;
			}
			if (l > 0) {
				if (!uuchar[*b++])
					return (0);
				--len;
				--l;
			}
			if (l > 0) {
				if (!uuchar[*b++])
					return (0);
				--len;
				--l;
			}
		}
		if (len-nl < 0)
			return (0);
		if (len-nl == 1 &&
		    (uuchar[*b] ||		 /* Check sum. */
		     (*b >= 'a' && *b <= 'z'))) {/* Padding data(MINIX). */
			++b;
			--len;
		}
		b += nl;
		if (avail && uuchar[*b])
			return (firstline+30);
	}
	if (l == 13) {
		while (len-nl > 0) {
			if (!base64[*b++])
				return (0);
			--len;
		}
		b += nl;

		if (avail >= 5 && memcmp(b, "====\n", 5) == 0)
			return (firstline+40);
		if (avail >= 6 && memcmp(b, "====\r\n", 6) == 0)
			return (firstline+40);
		if (avail > 0 && base64[*b])
			return (firstline+30);
	}

	return (0);
}